

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::PrintTotalBytesLimitError(CodedInputStream *this)

{
  LogMessage *pLVar1;
  LogFinisher local_55 [13];
  LogMessage local_48;
  CodedInputStream *local_10;
  CodedInputStream *this_local;
  
  local_10 = this;
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/coded_stream.cc"
             ,0xab);
  pLVar1 = internal::LogMessage::operator<<
                     (&local_48,"A protocol message was rejected because it was too big (more than "
                     );
  pLVar1 = internal::LogMessage::operator<<(pLVar1,this->total_bytes_limit_);
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,
                      " bytes).  To increase the limit (or to disable these warnings), see CodedInputStream::SetTotalBytesLimit() in google/protobuf/io/coded_stream.h."
                     );
  internal::LogFinisher::operator=(local_55,pLVar1);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void CodedInputStream::PrintTotalBytesLimitError() {
  GOOGLE_LOG(ERROR) << "A protocol message was rejected because it was too "
                "big (more than " << total_bytes_limit_
             << " bytes).  To increase the limit (or to disable these "
                "warnings), see CodedInputStream::SetTotalBytesLimit() "
                "in google/protobuf/io/coded_stream.h.";
}